

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

int av1_get_enc_border_size(_Bool resize,_Bool all_intra,BLOCK_SIZE sb_size)

{
  BLOCK_SIZE sb_size_local;
  _Bool all_intra_local;
  _Bool resize_local;
  int local_4;
  
  if (resize) {
    local_4 = 0x120;
  }
  else if (all_intra) {
    local_4 = 0x40;
  }
  else {
    local_4 = block_size_wide[sb_size] + 0x20;
  }
  return local_4;
}

Assistant:

static inline int av1_get_enc_border_size(bool resize, bool all_intra,
                                          BLOCK_SIZE sb_size) {
  // For allintra encoding mode, inter-frame motion search is not applicable and
  // the intraBC motion vectors are restricted within the tile boundaries. Hence
  // a smaller frame border size (AOM_ENC_ALLINTRA_BORDER) is used in this case.
  if (resize) {
    return AOM_BORDER_IN_PIXELS;
  }
  if (all_intra) {
    return AOM_ENC_ALLINTRA_BORDER;
  }
  return block_size_wide[sb_size] + 32;
}